

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

void __thiscall
absl::debugging_internal::ElfMemImage::SymbolIterator::Update(SymbolIterator *this,int increment)

{
  ElfMemImage *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Elf64_Sym *sym;
  Elf64_Versym *pEVar4;
  char *pcVar5;
  Elf64_Verdaux *pEVar6;
  void *pvVar7;
  Elf64_Verdaux *version_aux;
  char *absl_raw_logging_internal_basename_2;
  char *version_name;
  Elf64_Verdef *version_definition;
  Elf64_Versym version_index;
  char *symbol_name;
  char *absl_raw_logging_internal_basename_1;
  Elf64_Versym *version_symbol;
  Elf64_Sym *symbol;
  char *absl_raw_logging_internal_basename;
  ElfMemImage *image;
  int increment_local;
  SymbolIterator *this_local;
  
  this_00 = (ElfMemImage *)this->image_;
  bVar1 = IsPresent(this_00);
  if (!bVar1 && increment != 0) {
    raw_logging_internal::RawLog
              (kFatal,"elf_mem_image.cc",0x155,"Check %s failed: %s",
               "image->IsPresent() || increment == 0","");
  }
  bVar1 = IsPresent(this_00);
  if (bVar1) {
    this->index_ = increment + this->index_;
    iVar3 = this->index_;
    iVar2 = GetNumSymbols(this_00);
    if (iVar3 < iVar2) {
      sym = GetDynsym(this_00,this->index_);
      pEVar4 = GetVersym(this_00,this->index_);
      if (sym == (Elf64_Sym *)0x0 || pEVar4 == (Elf64_Versym *)0x0) {
        raw_logging_internal::RawLog
                  (kFatal,"elf_mem_image.cc",0x160,"Check %s failed: %s","symbol && version_symbol",
                   "");
      }
      pcVar5 = GetDynstr(this_00,sym->st_name);
      version_name = (char *)0x0;
      absl_raw_logging_internal_basename_2 = "";
      if (sym->st_shndx != 0) {
        version_name = (char *)GetVerdef(this_00,(uint)(*pEVar4 & 0x7fff));
      }
      if (version_name != (char *)0x0) {
        bVar1 = true;
        if (*(short *)(version_name + 6) != 1) {
          bVar1 = *(short *)(version_name + 6) == 2;
        }
        if (!bVar1) {
          raw_logging_internal::RawLog
                    (kFatal,"elf_mem_image.cc",0x175,"Check %s failed: %s",
                     "version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2",
                     "wrong number of entries");
        }
        pEVar6 = GetVerdefAux(this_00,(Elf64_Verdef *)version_name);
        absl_raw_logging_internal_basename_2 = GetVerstr(this_00,pEVar6->vda_name);
      }
      (this->info_).name = pcVar5;
      (this->info_).version = absl_raw_logging_internal_basename_2;
      pvVar7 = GetSymAddr(this_00,sym);
      (this->info_).address = pvVar7;
      (this->info_).symbol = sym;
    }
    else {
      iVar3 = GetNumSymbols(this_00);
      this->index_ = iVar3;
    }
  }
  return;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(int increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}